

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O2

qreal __thiscall
KDReports::SpreadsheetReportLayout::paintTableVerticalHeader
          (SpreadsheetReportLayout *this,qreal x,qreal y,QPainter *painter,int row)

{
  QAbstractItemModel *pQVar1;
  Alignment alignment;
  double dVar2;
  QColor QVar3;
  QVariant cellDecoration;
  QRectF local_c8;
  QString cellText;
  QVariant decorationAlignment;
  QColor local_58;
  QRectF local_48;
  
  pQVar1 = (this->m_tableLayout).m_model;
  local_c8.h = (this->m_tableLayout).m_rowHeight;
  local_c8.w = (this->m_tableLayout).m_vHeaderWidth;
  local_c8.xp = x;
  local_c8.yp = y;
  QFont::QFont((QFont *)&cellDecoration,&(this->m_tableLayout).m_verticalHeaderFontScaler.m_font);
  QPainter::setFont((QFont *)painter);
  QFont::~QFont((QFont *)&cellDecoration);
  QPainter::fillRect((QRectF *)painter,(QBrush *)&local_c8);
  drawBorder(this,&local_c8,painter);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&cellDecoration,pQVar1,row,2,9);
  QVar3 = qvariant_cast<QColor>(&cellDecoration);
  QVariant::~QVariant(&cellDecoration);
  if (QVar3.cspec != Invalid) {
    QPainter::setPen((QColor *)painter);
  }
  (**(code **)(*(long *)pQVar1 + 0xa0))(&cellDecoration,pQVar1,row,2,0);
  QVariant::toString();
  QVariant::~QVariant(&cellDecoration);
  dVar2 = (this->m_tableLayout).m_cellPadding *
          (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
  (**(code **)(*(long *)pQVar1 + 0xa0))(&cellDecoration,pQVar1,row,2,7);
  alignment.i = QVariant::toInt((bool *)&cellDecoration);
  QVariant::~QVariant(&cellDecoration);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&cellDecoration,pQVar1,row,2,1);
  (**(code **)(*(long *)pQVar1 + 0xa0))(&decorationAlignment,pQVar1,row,2,0x2d535fb1);
  local_48.xp = local_c8.xp + dVar2;
  local_48.yp = local_c8.yp + dVar2;
  local_48.w = (local_c8.w - dVar2) - dVar2;
  local_48.h = (local_c8.h - dVar2) - dVar2;
  paintTextAndIcon(this,painter,&local_48,&cellText,&cellDecoration,&decorationAlignment,alignment);
  if (QVar3.cspec != Invalid) {
    QColor::QColor(&local_58,black);
    QPainter::setPen((QColor *)painter);
  }
  dVar2 = x + local_c8.w;
  QVariant::~QVariant(&decorationAlignment);
  QVariant::~QVariant(&cellDecoration);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&cellText.d);
  return dVar2;
}

Assistant:

qreal KDReports::SpreadsheetReportLayout::paintTableVerticalHeader(qreal x, qreal y, QPainter &painter, int row)
{
    QAbstractItemModel *model = m_tableLayout.m_model;

    const QRectF cellRect(x, y, m_tableLayout.vHeaderWidth(), m_tableLayout.rowHeight());

    painter.setFont(m_tableLayout.verticalHeaderScaledFont());
    painter.fillRect(cellRect, m_tableSettings.m_headerBackground);
    drawBorder(cellRect, painter);

    const QColor foreground = qvariant_cast<QColor>(model->headerData(row, Qt::Vertical, Qt::ForegroundRole));
    if (foreground.isValid())
        painter.setPen(foreground);

    const QString cellText = model->headerData(row, Qt::Vertical).toString();
    const qreal padding = m_tableLayout.scaledCellPadding();
    const Qt::Alignment alignment(model->headerData(row, Qt::Vertical, Qt::TextAlignmentRole).toInt());
    const QVariant cellDecoration = model->headerData(row, Qt::Vertical, Qt::DecorationRole);
    const QVariant decorationAlignment = model->headerData(row, Qt::Vertical, KDReports::AutoTableElement::DecorationAlignmentRole);

    const QRectF cellContentsRect = cellRect.adjusted(padding, padding, -padding, -padding);
    // painter.drawText( cellContentsRect, alignment, cellText );
    paintTextAndIcon(painter, cellContentsRect, cellText, cellDecoration, decorationAlignment, alignment);

    if (foreground.isValid())
        painter.setPen(Qt::black);

    x += cellRect.width();
    return x;
}